

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

QLibraryPrivate * __thiscall QFactoryLoader::library(QFactoryLoader *this,QString *key)

{
  bool bVar1;
  Private *pPVar2;
  pointer ppVar3;
  Private *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
  *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  QLibraryPrivate *local_38;
  _Self local_30 [4];
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  Private::operator->(in_RDI);
  pPVar2 = Private::operator->(in_RDI);
  if (pPVar2->cs == CaseInsensitive) {
    QString::toLower((QString *)in_stack_ffffffffffffff78);
  }
  else {
    QString::QString(in_stack_ffffffffffffff80,(QString *)in_stack_ffffffffffffff78);
  }
  local_10._M_node =
       (_Base_ptr)
       std::
       map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x44362e);
  QString::~QString((QString *)0x443649);
  Private::operator->(in_RDI);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
       ::cend(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(&local_10,local_30);
  if (bVar1) {
    local_38 = (QLibraryPrivate *)0x0;
  }
  else {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_QString,_QLibraryPrivate_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_QString,_QLibraryPrivate_*>_> *)
                        0x4436af);
    local_38 = ppVar3->second;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

QLibraryPrivate *QFactoryLoader::library(const QString &key) const
{
    const auto it = d->keyMap.find(d->cs ? key : key.toLower());
    if (it == d->keyMap.cend())
        return nullptr;
    return it->second;
}